

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh_commit.cxx
# Opt level: O0

void __thiscall level_mesh::pre_commit(level_mesh *this)

{
  bool bVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  vector<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
  local_40;
  vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> local_28;
  level_mesh *local_10;
  level_mesh *this_local;
  
  local_10 = this;
  bVar1 = std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>::empty
                    (&this->m_instances);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_instances.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh_commit.cxx"
                  ,0xb4,"void level_mesh::pre_commit()");
  }
  xray_re::xr_mesh_builder::compact_raw_surfaces(&this->super_xr_mesh_builder);
  create_smoothing_groups(this);
  memset(&local_28,0,0x18);
  std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::vector
            (&local_28);
  std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::swap
            (&local_28,&(this->super_xr_mesh_builder).m_normals);
  std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::~vector
            (&local_28);
  memset(&local_40,0,0x18);
  std::vector<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>::
  vector(&local_40);
  std::vector<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>::
  swap(&local_40,&(this->super_xr_mesh_builder).m_edges);
  std::vector<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>::
  ~vector(&local_40);
  memset(&local_58,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_58);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::swap
            (&local_58,&(this->super_xr_mesh_builder).m_vertex_edges);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_58);
  xray_re::xr_mesh_builder::generate_vertex_faces(&this->super_xr_mesh_builder);
  return;
}

Assistant:

void level_mesh::pre_commit()
{
	xr_assert(!m_instances.empty());
	compact_raw_surfaces();
	create_smoothing_groups();
	std::vector<fvector3>().swap(m_normals);
	b_edge_vec().swap(m_edges);
	std::vector<uint32_t>().swap(m_vertex_edges);
	generate_vertex_faces();
}